

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O1

REF_STATUS ref_adj_add(REF_ADJ ref_adj,REF_INT node,REF_INT reference)

{
  uint uVar1;
  uint uVar2;
  REF_STATUS RVar3;
  REF_INT *pRVar4;
  REF_ADJ_ITEM pRVar5;
  int iVar6;
  uint uVar7;
  undefined8 uVar8;
  ulong uVar9;
  REF_INT RVar10;
  long lVar11;
  long lVar12;
  
  if (node < 0) {
    return 3;
  }
  uVar1 = ref_adj->nnode;
  lVar12 = (long)(int)uVar1;
  if (node < (int)uVar1) {
LAB_001450b2:
    if (ref_adj->blank == -1) {
      uVar1 = ref_adj->nitem;
      lVar12 = (long)(int)uVar1;
      if (lVar12 == 0x7fffffff) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x81,
               "ref_adj_add","the number of ref_adj items is too large for int, cannot grow");
        return 1;
      }
      uVar7 = 100;
      if (100 < (int)((double)(int)uVar1 * 0.5)) {
        uVar7 = (int)((double)(int)uVar1 * 0.5);
      }
      uVar2 = uVar1 ^ 0x7fffffff;
      if ((int)uVar7 < (int)(uVar1 ^ 0x7fffffff)) {
        uVar2 = uVar7;
      }
      ref_adj->nitem = uVar2 + uVar1;
      fflush(_stdout);
      if (0 < (long)ref_adj->nitem) {
        pRVar5 = (REF_ADJ_ITEM)realloc(ref_adj->item,(long)ref_adj->nitem << 3);
        ref_adj->item = pRVar5;
      }
      pRVar5 = ref_adj->item;
      if (pRVar5 == (REF_ADJ_ITEM)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x88,
               "ref_adj_add","realloc ref_adj->item NULL");
        uVar9 = (ulong)ref_adj->nitem;
        lVar12 = uVar9 * 8;
        uVar8 = 8;
        goto LAB_00145268;
      }
      iVar6 = ref_adj->nitem;
      if ((int)uVar1 < iVar6) {
        lVar11 = 0;
        do {
          pRVar5[lVar12 + lVar11].ref = -1;
          pRVar5[lVar12 + lVar11].next = uVar1 + 1 + (int)lVar11;
          lVar11 = lVar11 + 1;
        } while (iVar6 - lVar12 != lVar11);
      }
      pRVar5[(long)iVar6 + -1].next = -1;
      ref_adj->blank = uVar1;
    }
    iVar6 = ref_adj->blank;
    pRVar5 = ref_adj->item;
    ref_adj->blank = pRVar5[iVar6].next;
    pRVar5[iVar6].ref = reference;
    RVar10 = -1;
    if (node < ref_adj->nnode) {
      RVar10 = ref_adj->first[(uint)node];
    }
    pRVar5[iVar6].next = RVar10;
    ref_adj->first[(uint)node] = iVar6;
    RVar3 = 0;
  }
  else {
    iVar6 = 0;
    if (0 < (int)(node - uVar1)) {
      iVar6 = node - uVar1;
    }
    uVar7 = iVar6 + 100U;
    if ((int)(iVar6 + 100U) <= (int)((double)(int)uVar1 * 0.5)) {
      uVar7 = (int)((double)(int)uVar1 * 0.5);
    }
    uVar2 = uVar1 ^ 0x7fffffff;
    if ((int)uVar7 < (int)(uVar1 ^ 0x7fffffff)) {
      uVar2 = uVar7;
    }
    ref_adj->nnode = uVar2 + uVar1;
    fflush(_stdout);
    if (0 < (long)ref_adj->nnode) {
      pRVar4 = (REF_INT *)realloc(ref_adj->first,(long)ref_adj->nnode << 2);
      ref_adj->first = pRVar4;
    }
    pRVar4 = ref_adj->first;
    if (pRVar4 != (REF_INT *)0x0) {
      if ((int)uVar1 < ref_adj->nnode) {
        do {
          pRVar4[lVar12] = -1;
          lVar12 = lVar12 + 1;
        } while (lVar12 < ref_adj->nnode);
      }
      goto LAB_001450b2;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x7a,
           "ref_adj_add","realloc ref_adj->first NULL");
    uVar9 = (ulong)ref_adj->nnode;
    lVar12 = uVar9 * 4;
    uVar8 = 4;
LAB_00145268:
    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar9 & 0xffffffff,uVar9,uVar8
           ,lVar12);
    RVar3 = 2;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_adj_add(REF_ADJ ref_adj, REF_INT node,
                               REF_INT reference) {
  REF_INT item;
  REF_INT orig, chunk, i;
  REF_INT max_limit = REF_INT_MAX;

  if (node < 0) return REF_INVALID;

  if (node >= ref_adj_nnode(ref_adj)) {
    orig = ref_adj_nnode(ref_adj);
    chunk = 100 + MAX(0, node - orig);
    chunk = MAX(chunk, (REF_INT)(0.5 * (REF_DBL)orig));
    /* try to keep under 32-bit limit */
    chunk = MIN(chunk, max_limit - orig);
    ref_adj_nnode(ref_adj) = orig + chunk;
    ref_realloc(ref_adj->first, ref_adj_nnode(ref_adj), REF_INT);
    for (i = orig; i < ref_adj_nnode(ref_adj); i++)
      ref_adj->first[i] = REF_EMPTY;
  }

  if (REF_EMPTY == ref_adj_blank(ref_adj)) {
    RAS(ref_adj_nitem(ref_adj) != max_limit,
        "the number of ref_adj items is too large for int, cannot grow");

    orig = ref_adj_nitem(ref_adj);
    chunk = MAX(100, (REF_INT)(0.5 * (REF_DBL)orig));
    /* try to keep under 32-bit limit */
    chunk = MIN(chunk, max_limit - orig);
    ref_adj_nitem(ref_adj) = orig + chunk;
    ref_realloc(ref_adj->item, ref_adj_nitem(ref_adj), REF_ADJ_ITEM_STRUCT);
    for (i = orig; i < ref_adj_nitem(ref_adj); i++) {
      ref_adj->item[i].ref = REF_EMPTY;
      ref_adj->item[i].next = i + 1;
    }
    ref_adj->item[ref_adj_nitem(ref_adj) - 1].next = REF_EMPTY;
    ref_adj->blank = orig;
  }

  item = ref_adj_blank(ref_adj);
  ref_adj_blank(ref_adj) = ref_adj_item_next(ref_adj, item);

  ref_adj_item_ref(ref_adj, item) = reference;
  ref_adj_item_next(ref_adj, item) = ref_adj_first(ref_adj, node);

  ref_adj->first[node] = item;

  return REF_SUCCESS;
}